

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.h
# Opt level: O2

void convolve_2d_sr_hor_8tap_avx2
               (uint8_t *src,int32_t src_stride,int32_t w,int32_t h,
               InterpFilterParams *filter_params_x,int32_t subpel_x_q4,int16_t *im_block)

{
  undefined1 auVar1 [16];
  uint uVar2;
  __m256i *filt;
  __m256i *filt_00;
  __m256i *palVar3;
  uint8_t *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  __m256i alVar8;
  undefined1 auVar9 [64];
  __m256i filt_256 [4];
  __m256i coeffs_256 [4];
  __m256i r [2];
  longlong local_1a0 [16];
  undefined8 local_120;
  undefined2 uStack_118;
  undefined2 uStack_116;
  undefined2 uStack_114;
  undefined2 uStack_112;
  undefined2 uStack_110;
  undefined2 uStack_10e;
  undefined2 uStack_10c;
  undefined2 uStack_10a;
  undefined2 uStack_108;
  undefined2 uStack_106;
  undefined2 uStack_104;
  undefined2 uStack_102;
  undefined2 local_100;
  undefined2 uStack_fe;
  undefined2 uStack_fc;
  undefined2 uStack_fa;
  undefined2 uStack_f8;
  undefined2 uStack_f6;
  undefined2 uStack_f4;
  undefined2 uStack_f2;
  undefined2 uStack_f0;
  undefined2 uStack_ee;
  undefined2 uStack_ec;
  undefined2 uStack_ea;
  undefined2 uStack_e8;
  undefined2 uStack_e6;
  undefined2 uStack_e4;
  undefined2 uStack_e2;
  undefined2 local_e0;
  undefined2 uStack_de;
  undefined2 uStack_dc;
  undefined2 uStack_da;
  undefined2 uStack_d8;
  undefined2 uStack_d6;
  undefined2 uStack_d4;
  undefined2 uStack_d2;
  undefined2 uStack_d0;
  undefined2 uStack_ce;
  undefined2 uStack_cc;
  undefined2 uStack_ca;
  undefined2 uStack_c8;
  undefined2 uStack_c6;
  undefined2 uStack_c4;
  undefined2 uStack_c2;
  undefined1 local_c0 [32];
  __m256i local_a0;
  __m256i local_80;
  
  local_1a0[0] = 0x403030202010100;
  local_1a0[1] = 0x807070606050504;
  local_1a0[2] = 0x403030202010100;
  local_1a0[3] = 0x807070606050504;
  local_1a0[4] = 0x605050404030302;
  local_1a0[5] = 0xa09090808070706;
  local_1a0[6] = 0x605050404030302;
  local_1a0[7] = 0xa09090808070706;
  local_1a0[8] = 0x807070606050504;
  local_1a0[9] = 0xc0b0b0a0a090908;
  local_1a0[10] = 0x807070606050504;
  local_1a0[0xb] = 0xc0b0b0a0a090908;
  local_1a0[0xc] = 0xa09090808070706;
  local_1a0[0xd] = 0xe0d0d0c0c0b0b0a;
  local_1a0[0xe] = 0xa09090808070706;
  local_1a0[0xf] = 0xe0d0d0c0c0b0b0a;
  auVar5 = vpsraw_avx(*(undefined1 (*) [16])
                       (filter_params_x->filter_ptr +
                       (uint)filter_params_x->taps * (subpel_x_q4 & 0xfU)),1);
  auVar1 = vpshufb_avx(auVar5,_DAT_004bd980);
  local_120._0_2_ = auVar1._0_2_;
  auVar1 = vpshufb_avx(auVar5,_DAT_004bd8e0);
  local_100 = auVar1._0_2_;
  auVar1 = vpshufb_avx(auVar5,_DAT_004bd8f0);
  local_e0 = auVar1._0_2_;
  auVar1 = vpshufb_avx(auVar5,_DAT_004bd990);
  local_c0._0_2_ = auVar1._0_2_;
  local_c0._2_2_ = local_c0._0_2_;
  local_c0._4_2_ = local_c0._0_2_;
  local_c0._6_2_ = local_c0._0_2_;
  local_c0._8_2_ = local_c0._0_2_;
  local_c0._10_2_ = local_c0._0_2_;
  local_c0._12_2_ = local_c0._0_2_;
  local_c0._14_2_ = local_c0._0_2_;
  local_c0._16_2_ = local_c0._0_2_;
  local_c0._18_2_ = local_c0._0_2_;
  local_c0._20_2_ = local_c0._0_2_;
  local_c0._22_2_ = local_c0._0_2_;
  local_c0._24_2_ = local_c0._0_2_;
  local_c0._26_2_ = local_c0._0_2_;
  local_c0._28_2_ = local_c0._0_2_;
  local_c0._30_2_ = local_c0._0_2_;
  auVar9 = ZEXT3264(local_c0);
  uVar2 = w << 0x1d | w - 8U >> 3;
  filt = (__m256i *)(long)src_stride;
  local_120._2_2_ = (undefined2)local_120;
  local_120._4_2_ = (undefined2)local_120;
  local_120._6_2_ = (undefined2)local_120;
  uStack_118 = (undefined2)local_120;
  uStack_116 = (undefined2)local_120;
  uStack_114 = (undefined2)local_120;
  uStack_112 = (undefined2)local_120;
  uStack_110 = (undefined2)local_120;
  uStack_10e = (undefined2)local_120;
  uStack_10c = (undefined2)local_120;
  uStack_10a = (undefined2)local_120;
  uStack_108 = (undefined2)local_120;
  uStack_106 = (undefined2)local_120;
  uStack_104 = (undefined2)local_120;
  uStack_102 = (undefined2)local_120;
  uStack_fe = local_100;
  uStack_fc = local_100;
  uStack_fa = local_100;
  uStack_f8 = local_100;
  uStack_f6 = local_100;
  uStack_f4 = local_100;
  uStack_f2 = local_100;
  uStack_f0 = local_100;
  uStack_ee = local_100;
  uStack_ec = local_100;
  uStack_ea = local_100;
  uStack_e8 = local_100;
  uStack_e6 = local_100;
  uStack_e4 = local_100;
  uStack_e2 = local_100;
  uStack_de = local_e0;
  uStack_dc = local_e0;
  uStack_da = local_e0;
  uStack_d8 = local_e0;
  uStack_d6 = local_e0;
  uStack_d4 = local_e0;
  uStack_d2 = local_e0;
  uStack_d0 = local_e0;
  uStack_ce = local_e0;
  uStack_cc = local_e0;
  uStack_ca = local_e0;
  uStack_c8 = local_e0;
  uStack_c6 = local_e0;
  uStack_c4 = local_e0;
  uStack_c2 = local_e0;
  if (uVar2 < 8) {
    palVar3 = (__m256i *)(src + -3);
    switch(uVar2) {
    case 0:
      auVar6._8_2_ = 2;
      auVar6._0_8_ = 0x2000200020002;
      auVar6._10_2_ = 2;
      auVar6._12_2_ = 2;
      auVar6._14_2_ = 2;
      auVar6._16_2_ = 2;
      auVar6._18_2_ = 2;
      auVar6._20_2_ = 2;
      auVar6._22_2_ = 2;
      auVar6._24_2_ = 2;
      auVar6._26_2_ = 2;
      auVar6._28_2_ = 2;
      auVar6._30_2_ = 2;
      auVar7 = auVar6;
      do {
        x_convolve_8tap_8x2_avx2
                  (palVar3,(uint8_t *)filt,(ptrdiff_t)&local_120,(__m256i *)local_1a0,filt);
        auVar7 = vpaddw_avx2(auVar7,auVar6);
        auVar7 = vpsraw_avx2(auVar7,2);
        *(undefined1 (*) [32])im_block = auVar7;
        palVar3 = (__m256i *)((long)*palVar3 + (long)(src_stride * 2));
        im_block = (int16_t *)((long)im_block + 0x20);
        h = h + -2;
      } while (h != 0);
      break;
    case 1:
      palVar3 = (__m256i *)(src + 5);
      do {
        alVar8 = auVar9._0_32_;
        filt_00 = filt;
        x_convolve_8tap_8x2_avx2
                  ((__m256i *)(palVar3[-1] + 3),(uint8_t *)filt,(ptrdiff_t)&local_120,
                   (__m256i *)local_1a0,filt);
        local_a0 = alVar8;
        x_convolve_8tap_8x2_avx2
                  (palVar3,(uint8_t *)filt,(ptrdiff_t)&local_120,(__m256i *)local_1a0,filt_00);
        auVar9 = ZEXT1664(alVar8._0_16_);
        local_80 = alVar8;
        xy_x_round_store_32_avx2(&local_a0,im_block);
        im_block = im_block + 0x20;
        palVar3 = (__m256i *)((long)*palVar3 + (long)(src_stride * 2));
        h = h + -2;
      } while (h != 0);
      break;
    default:
      goto switchD_003a7d07_caseD_2;
    case 3:
      do {
        xy_x_8tap_32_avx2((uint8_t *)palVar3,(__m256i *)&local_120,(__m256i *)local_1a0,im_block);
        palVar3 = (__m256i *)((long)*filt + (long)*palVar3);
        im_block = im_block + 0x20;
        h = h + -1;
      } while (h != 0);
      break;
    case 7:
      puVar4 = src + 0x1d;
      do {
        xy_x_8tap_32_avx2(puVar4 + -0x20,(__m256i *)&local_120,(__m256i *)local_1a0,im_block);
        xy_x_8tap_32_avx2(puVar4,(__m256i *)&local_120,(__m256i *)local_1a0,im_block + 0x20);
        puVar4 = puVar4 + (long)filt;
        im_block = im_block + 0x40;
        h = h + -1;
      } while (h != 0);
    }
  }
  else {
switchD_003a7d07_caseD_2:
    puVar4 = src + 0x5d;
    do {
      xy_x_8tap_32_avx2(puVar4 + -0x60,(__m256i *)&local_120,(__m256i *)local_1a0,im_block);
      xy_x_8tap_32_avx2(puVar4 + -0x40,(__m256i *)&local_120,(__m256i *)local_1a0,im_block + 0x20);
      xy_x_8tap_32_avx2(puVar4 + -0x20,(__m256i *)&local_120,(__m256i *)local_1a0,im_block + 0x40);
      xy_x_8tap_32_avx2(puVar4,(__m256i *)&local_120,(__m256i *)local_1a0,im_block + 0x60);
      puVar4 = puVar4 + (long)filt;
      im_block = im_block + 0x80;
      h = h + -1;
    } while (h != 0);
  }
  return;
}

Assistant:

static void convolve_2d_sr_hor_8tap_avx2(
    const uint8_t *const src, const int32_t src_stride, const int32_t w,
    const int32_t h, const InterpFilterParams *const filter_params_x,
    const int32_t subpel_x_q4, int16_t *const im_block) {
  const uint8_t *src_ptr = src - 3;
  int32_t y = h;
  int16_t *im = im_block;
  __m256i coeffs_256[4], filt_256[4];

  filt_256[0] = _mm256_loadu_si256((__m256i const *)filt1_global_avx2);
  filt_256[1] = _mm256_loadu_si256((__m256i const *)filt2_global_avx2);
  filt_256[2] = _mm256_loadu_si256((__m256i const *)filt3_global_avx2);
  filt_256[3] = _mm256_loadu_si256((__m256i const *)filt4_global_avx2);

  prepare_half_coeffs_8tap_avx2(filter_params_x, subpel_x_q4, coeffs_256);

  if (w == 8) {
    do {
      const __m256i res =
          x_convolve_8tap_8x2_avx2(src_ptr, src_stride, coeffs_256, filt_256);
      xy_x_round_store_8x2_avx2(res, im);
      src_ptr += 2 * src_stride;
      im += 2 * 8;
      y -= 2;
    } while (y);
  } else if (w == 16) {
    do {
      __m256i r[2];

      x_convolve_8tap_16x2_avx2(src_ptr, src_stride, coeffs_256, filt_256, r);
      xy_x_round_store_32_avx2(r, im);
      src_ptr += 2 * src_stride;
      im += 2 * 16;
      y -= 2;
    } while (y);
  } else if (w == 32) {
    do {
      xy_x_8tap_32_avx2(src_ptr, coeffs_256, filt_256, im);
      src_ptr += src_stride;
      im += 32;
    } while (--y);
  } else if (w == 64) {
    do {
      xy_x_8tap_32_avx2(src_ptr, coeffs_256, filt_256, im);
      xy_x_8tap_32_avx2(src_ptr + 32, coeffs_256, filt_256, im + 32);
      src_ptr += src_stride;
      im += 64;
    } while (--y);
  } else {
    assert(w == 128);

    do {
      xy_x_8tap_32_avx2(src_ptr, coeffs_256, filt_256, im);
      xy_x_8tap_32_avx2(src_ptr + 32, coeffs_256, filt_256, im + 32);
      xy_x_8tap_32_avx2(src_ptr + 64, coeffs_256, filt_256, im + 64);
      xy_x_8tap_32_avx2(src_ptr + 96, coeffs_256, filt_256, im + 96);
      src_ptr += src_stride;
      im += 128;
    } while (--y);
  }
}